

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O2

void wpe_input_xkb_context_try_ensure_compose_table(wpe_input_xkb_context *xkb_context)

{
  xkb_context *pxVar1;
  char *pcVar2;
  long lVar3;
  xkb_compose_state *pxVar4;
  
  if (xkb_context->compose_state == (xkb_compose_state *)0x0) {
    pxVar1 = xkb_context->context;
    pcVar2 = setlocale(0,(char *)0x0);
    lVar3 = xkb_compose_table_new_from_locale(pxVar1,pcVar2,0);
    if (lVar3 != 0) {
      pxVar4 = (xkb_compose_state *)xkb_compose_state_new(lVar3,0);
      xkb_context->compose_state = pxVar4;
      xkb_compose_table_unref(lVar3);
      return;
    }
  }
  return;
}

Assistant:

static void
wpe_input_xkb_context_try_ensure_compose_table(struct wpe_input_xkb_context* xkb_context)
{
    if (xkb_context->compose_state)
        return;

    struct xkb_compose_table* compose_table = xkb_compose_table_new_from_locale(xkb_context->context, setlocale(LC_CTYPE, NULL), XKB_COMPOSE_COMPILE_NO_FLAGS);
    if (compose_table) {
        xkb_context->compose_state = xkb_compose_state_new(compose_table, XKB_COMPOSE_STATE_NO_FLAGS);
        xkb_compose_table_unref(compose_table);
    }
}